

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_36::NetworkHttpClient::connect
          (NetworkHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Detail *pDVar1;
  _func_int **pp_Var2;
  byte *pbVar3;
  long *plVar4;
  SourceLocation location;
  OwnPromiseNode OVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  PromiseArenaMember *node;
  HttpClient node_00;
  PromiseBase node_01;
  NetworkHttpClient *pNVar8;
  void *pvVar9;
  Timer *pTVar10;
  _func_int **pp_Var11;
  Exception *pEVar12;
  undefined8 *puVar13;
  undefined4 in_register_00000034;
  ArrayDisposer *pAVar14;
  char *in_R9;
  TransformPromiseNodeBase *this_00;
  undefined **ppuVar15;
  TransitionaryAsyncIoStream *ptrCopy;
  RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>
  *ptrCopy_2;
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> addr;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  OwnPromiseNode local_a0;
  undefined1 local_98 [24];
  PromiseArenaMember *local_80;
  HttpClient local_78;
  OwnPromiseNode local_70;
  PromiseBase local_68;
  NetworkHttpClient *local_60;
  OwnPromiseNode local_58;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  PromiseArenaMember *local_38;
  
  pAVar14 = (ArrayDisposer *)CONCAT44(in_register_00000034,__fd);
  local_60 = this;
  if (*in_R9 == '\x01') {
    if (pAVar14[5]._vptr_ArrayDisposer == (_func_int **)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                ((Fault *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x18b3,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support TLS\"",
                 (char (*) [36])"this HttpClient doesn\'t support TLS");
      kj::_::Debug::Fault::fatal((Fault *)local_98);
    }
    (**(code **)*pAVar14[5]._vptr_ArrayDisposer)(local_98);
  }
  else {
    (**(code **)*pAVar14[4]._vptr_ArrayDisposer)(local_98);
  }
  local_a0.ptr = (PromiseNode *)local_98._0_8_;
  pDVar1 = (Detail *)(((String *)local_98._0_8_)->content).size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)(local_98._0_8_ - (long)pDVar1) < 0x28) {
    pvVar9 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_a0,
               (anonymous_namespace)::NetworkHttpClient::
               connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
               {lambda(auto:1)#1}::operator());
    *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_destroy_0061bdb0;
    *(ArrayDisposer **)((long)pvVar9 + 0x3f8) = pAVar14;
    *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
  }
  else {
    (((String *)local_98._0_8_)->content).size_ = 0;
    this_00 = (TransformPromiseNodeBase *)&((Exception *)(local_98._0_8_ + -400))->traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_a0,
               (anonymous_namespace)::NetworkHttpClient::
               connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
               {lambda(auto:1)#1}::operator());
    *(undefined ***)&((Exception *)(local_98._0_8_ + -400))->traceCount = &PTR_destroy_0061bdb0;
    (((Exception *)(local_98._0_8_ + -400))->details).builder.disposer = pAVar14;
    (((Exception *)(local_98._0_8_ + -400))->details).builder.ptr = pDVar1;
  }
  local_98._0_8_ = &DAT_0048a171;
  local_98._8_8_ = &DAT_0048a1d0;
  local_98._16_8_ = &DAT_4c0000058b;
  local_58.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_38,&local_58,(SourceLocation *)local_98);
  OVar5.ptr = local_58.ptr;
  local_80 = local_38;
  if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "connect";
  local_40 = 0x28000018b9;
  location.function = "connect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x18b9;
  location.columnNumber = 0x28;
  Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
           *)&local_78,location);
  node = local_80;
  if (local_80 != (PromiseArenaMember *)0x0) {
    local_80 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  local_68.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_70.ptr;
  local_70.ptr = (PromiseNode *)0x0;
  newPromisedStream((kj *)local_98,(Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_68
                   );
  node_01.node.ptr = local_68.node.ptr;
  if (local_68.node.ptr != (PromiseNode *)0x0) {
    local_68.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01.node.ptr);
  }
  if (((*in_R9 == '\0') &&
      (pp_Var2 = pAVar14[0xb]._vptr_ArrayDisposer, pp_Var2 != (_func_int **)0x0)) &&
     (pbVar3 = *(byte **)(in_R9 + 8), pbVar3 != (byte *)0x0)) {
    pTVar10 = (Timer *)operator_new(0x20);
    uVar7 = local_98._8_8_;
    uVar6 = local_98._0_8_;
    local_98._8_8_ = (char *)0x0;
    (pTVar10->super_MonotonicClock)._vptr_MonotonicClock = (_func_int **)&PTR_read_0061bea0;
    pTVar10[1].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)&PTR_write_0061bf40;
    pp_Var11 = (_func_int **)operator_new(0x30);
    *pp_Var11 = (_func_int *)&PTR_read_00619860;
    pp_Var11[1] = (_func_int *)&DAT_00619900;
    pp_Var11[2] = (_func_int *)uVar6;
    pp_Var11[3] = (_func_int *)uVar7;
    pp_Var11[4] = (_func_int *)0x0;
    *(undefined2 *)(pp_Var11 + 5) = 0;
    pTVar10[2].super_MonotonicClock._vptr_MonotonicClock =
         (_func_int **)&kj::_::HeapDisposer<kj::PausableReadAsyncIoStream>::instance;
    pTVar10[3].super_MonotonicClock._vptr_MonotonicClock = pp_Var11;
    pEVar12 = (Exception *)operator_new(0x20);
    ppuVar15 = &PTR_disposeImpl_0061be60;
    (pEVar12->ownFile).content.ptr = (char *)&PTR_disposeImpl_0061be60;
    (pEVar12->ownFile).content.disposer =
         (ArrayDisposer *)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::instance;
    pEVar12->file = (char *)pTVar10;
    *(undefined4 *)&(pEVar12->ownFile).content.size_ = 2;
    puVar13 = (undefined8 *)operator_new(0x20);
    *puVar13 = &PTR_operator___0061bfc0;
    puVar13[1] = pp_Var2;
    puVar13[2] = pEVar12;
    puVar13[3] = pTVar10;
    *(undefined4 *)&(pEVar12->ownFile).content.size_ = 3;
    local_98._0_8_ = pEVar12;
    local_98._8_8_ = pTVar10;
    if ((*pbVar3 & 1) != 0) {
      *pbVar3 = 0;
      plVar4 = *(long **)(pbVar3 + 0x10);
      if (plVar4 != (long *)0x0) {
        pbVar3[0x10] = 0;
        pbVar3[0x11] = 0;
        pbVar3[0x12] = 0;
        pbVar3[0x13] = 0;
        pbVar3[0x14] = 0;
        pbVar3[0x15] = 0;
        pbVar3[0x16] = 0;
        pbVar3[0x17] = 0;
        (**(code **)**(undefined8 **)(pbVar3 + 8))
                  (*(undefined8 **)(pbVar3 + 8),(long)plVar4 + *(long *)(*plVar4 + -0x10));
        ppuVar15 = (undefined **)(pEVar12->ownFile).content.ptr;
      }
    }
    *(undefined8 **)(pbVar3 + 8) =
         &kj::_::
          HeapDisposer<kj::Function<kj::Promise<void>(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::StringPtr)#1}>>
          ::instance;
    *(undefined8 **)(pbVar3 + 0x10) = puVar13;
    *pbVar3 = 1;
    (*(code *)*ppuVar15)(pEVar12,(undefined *)((long)pEVar12->trace + (long)(ppuVar15[-2] + -0x68)))
    ;
  }
  pNVar8 = local_60;
  OVar5.ptr = (PromiseNode *)local_70;
  (local_60->super_HttpClient)._vptr_HttpClient = local_78._vptr_HttpClient;
  local_78._vptr_HttpClient = (_func_int **)0x0;
  (local_60->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_98._0_8_;
  local_60->timer = (Timer *)local_98._8_8_;
  if (&(local_70.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_70.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
    node_00._vptr_HttpClient = local_78._vptr_HttpClient;
    if ((PromiseArenaMember *)local_78._vptr_HttpClient != (PromiseArenaMember *)0x0) {
      local_78._vptr_HttpClient = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00._vptr_HttpClient);
    }
  }
  OVar5.ptr = local_a0.ptr;
  if (&(local_a0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_a0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  return (int)pNVar8;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers,
      HttpConnectSettings connectSettings) override {
    // We want to connect directly instead of going through a proxy here.
    // https://github.com/capnproto/capnproto/pull/1454#discussion_r900414879
    kj::Maybe<kj::Promise<kj::Own<kj::NetworkAddress>>> addr;
    if (connectSettings.useTls) {
      kj::Network& tlsNet = KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support TLS");
      addr = tlsNet.parseAddress(host);
    } else {
      addr = network.parseAddress(host);
    }

    auto split = KJ_ASSERT_NONNULL(addr).then([this](auto address) {
      return address->connect().then([this](auto connection)
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        return kj::tuple(
            ConnectRequest::Status(
              200,
              kj::str("OK"),
              kj::heap<kj::HttpHeaders>(responseHeaderTable) // Empty headers
            ),
            kj::mv(connection));
      }).attach(kj::mv(address));
    }).split();

    auto connection = kj::newPromisedStream(kj::mv(kj::get<1>(split)));

    if (!connectSettings.useTls) {
      KJ_IF_SOME(wrapper, settings.tlsContext) {
        KJ_IF_SOME(tlsStarter, connectSettings.tlsStarter) {
          auto transitConnectionRef = kj::refcountedWrapper(
              kj::heap<TransitionaryAsyncIoStream>(kj::mv(connection)));
          Function<kj::Promise<void>(kj::StringPtr)> cb =
              [&wrapper, ref1 = transitConnectionRef->addWrappedRef()](
              kj::StringPtr expectedServerHostname) mutable {
            ref1->startTls(&wrapper, expectedServerHostname);
            return kj::READY_NOW;
          };
          connection = transitConnectionRef->addWrappedRef();
          tlsStarter = kj::mv(cb);
        }
      }
    }

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::mv(connection)
    };
  }